

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_aout.c
# Opt level: O0

void aoutstd_writeexec(GlobalVars *gv,FILE *f)

{
  uint32_t tsize;
  uint32_t bsize;
  int iVar1;
  GlobalVars *in_RSI;
  long in_RDI;
  LinkedSection *sections [3];
  int be;
  uint32_t mid;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 uVar3;
  uint32_t in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff94;
  uint8_t in_stack_ffffffffffffff96;
  uint8_t in_stack_ffffffffffffff97;
  LinkedSection **in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint32_t uVar4;
  uint32_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint32_t in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint32_t in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffd0;
  
  uVar4 = fff[*(byte *)(in_RDI + 0x58)]->id;
  tsize = (uint32_t)fff[*(byte *)(in_RDI + 0x58)]->endianess;
  if ((int)tsize < 0) {
    tsize = (uint32_t)*(char *)(in_RDI + 0x21a);
  }
  aout_initwrite((GlobalVars *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (LinkedSection **)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8) == 0) {
    error(0x61,fff[*(byte *)(in_RDI + 0x58)]->tname,".text");
  }
  aout_addsymlist((GlobalVars *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                  in_stack_ffffffffffffff98,in_stack_ffffffffffffff97,in_stack_ffffffffffffff96,
                  in_stack_ffffffffffffff90);
  aout_addsymlist((GlobalVars *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                  in_stack_ffffffffffffff98,in_stack_ffffffffffffff97,in_stack_ffffffffffffff96,
                  in_stack_ffffffffffffff90);
  aout_addsymlist((GlobalVars *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                  in_stack_ffffffffffffff98,in_stack_ffffffffffffff97,in_stack_ffffffffffffff96,
                  in_stack_ffffffffffffff90);
  aout_debugsyms((GlobalVars *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff7c);
  calc_relocs((GlobalVars *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
              (LinkedSection *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  calc_relocs((GlobalVars *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
              (LinkedSection *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  isPIC((LinkedSection **)&stack0xffffffffffffffb8);
  aout_getpagedsize(in_RSI,(LinkedSection **)
                           CONCAT17(in_stack_ffffffffffffff97,
                                    CONCAT16(in_stack_ffffffffffffff96,
                                             CONCAT24(in_stack_ffffffffffffff94,
                                                      in_stack_ffffffffffffff90))),
                    in_stack_ffffffffffffff8c);
  bsize = aout_getpagedsize(in_RSI,(LinkedSection **)
                                   CONCAT17(in_stack_ffffffffffffff97,
                                            CONCAT16(in_stack_ffffffffffffff96,
                                                     CONCAT24(in_stack_ffffffffffffff94,
                                                              in_stack_ffffffffffffff90))),
                            in_stack_ffffffffffffff8c);
  aout_getpagedsize(in_RSI,(LinkedSection **)
                           CONCAT17(in_stack_ffffffffffffff97,
                                    CONCAT16(in_stack_ffffffffffffff96,
                                             CONCAT24(in_stack_ffffffffffffff94,
                                                      in_stack_ffffffffffffff90))),
                    in_stack_ffffffffffffff8c);
  iVar1 = aoutsymlist.nextindex * 0xc;
  entry_address((GlobalVars *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  uVar2 = 0;
  uVar3 = 0;
  aout_header((FILE *)CONCAT44(uVar4,in_stack_ffffffffffffffa0),(uint32_t)((ulong)in_RSI >> 0x20),
              (uint32_t)in_RSI,
              CONCAT13(in_stack_ffffffffffffff97,
                       CONCAT12(in_stack_ffffffffffffff96,in_stack_ffffffffffffff94)),tsize,
              in_stack_ffffffffffffff8c,bsize,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0,
              in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0,tsize);
  aout_pagedsection((GlobalVars *)
                    CONCAT17(in_stack_ffffffffffffff97,
                             CONCAT16(in_stack_ffffffffffffff96,
                                      CONCAT24(in_stack_ffffffffffffff94,tsize))),
                    (FILE *)CONCAT44(in_stack_ffffffffffffff8c,uVar3),
                    (LinkedSection **)CONCAT44(in_stack_ffffffffffffff84,uVar2),
                    in_stack_ffffffffffffff7c);
  aout_pagedsection((GlobalVars *)
                    CONCAT17(in_stack_ffffffffffffff97,
                             CONCAT16(in_stack_ffffffffffffff96,
                                      CONCAT24(in_stack_ffffffffffffff94,tsize))),
                    (FILE *)CONCAT44(in_stack_ffffffffffffff8c,uVar3),
                    (LinkedSection **)CONCAT44(in_stack_ffffffffffffff84,uVar2),
                    in_stack_ffffffffffffff7c);
  aout_writesymbols((FILE *)CONCAT44(in_stack_ffffffffffffff74,iVar1));
  aout_writestrings((FILE *)CONCAT17(in_stack_ffffffffffffff97,
                                     CONCAT16(in_stack_ffffffffffffff96,
                                              CONCAT24(in_stack_ffffffffffffff94,tsize))),
                    in_stack_ffffffffffffff8c);
  return;
}

Assistant:

void aoutstd_writeexec(struct GlobalVars *gv,FILE *f)
/* creates a standard a.out paged executable file */
{
  uint32_t mid = fff[gv->dest_format]->id;
  int be = (int)fff[gv->dest_format]->endianess;
  struct LinkedSection *sections[3];

  if (be < 0)
    be = gv->endianess;
  aout_initwrite(gv,sections);
  if (sections[0] == NULL)  /* this requires a .text section! */
    error(97,fff[gv->dest_format]->tname,TEXTNAME);
  aout_addsymlist(gv,sections,BIND_GLOBAL,0,be);
  aout_addsymlist(gv,sections,BIND_WEAK,0,be);
  aout_addsymlist(gv,sections,BIND_LOCAL,0,be);
  aout_debugsyms(gv,be);
  calc_relocs(gv,sections[0]);
  calc_relocs(gv,sections[1]);

  aout_header(f,ZMAGIC,mid,isPIC(sections) ? EX_PIC : 0, /* @@@ DYNAMIC? */
              aout_getpagedsize(gv,sections,0),
              aout_getpagedsize(gv,sections,1),
              aout_getpagedsize(gv,sections,2),
              aoutsymlist.nextindex * sizeof(struct nlist32),
              (uint32_t)entry_address(gv),0,0,be);
  aout_pagedsection(gv,f,sections,0);
  aout_pagedsection(gv,f,sections,1);
  aout_writesymbols(f);
  aout_writestrings(f,be);
}